

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__instance_rigid_constraint
          (ColladaParserAutoGen15Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__instance_rigid_constraint()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__instance_rigid_constraint();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}